

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

bool __thiscall roaring::Roaring64Map::runOptimize(Roaring64Map *this)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  *in_RDI;
  
  iVar2 = std::
          map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
          ::begin(in_RDI);
  iVar3 = std::
          map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
          ::end(in_RDI);
  bVar1 = std::
          accumulate<std::_Rb_tree_iterator<std::pair<unsigned_int_const,roaring::Roaring>>,bool,roaring::Roaring64Map::runOptimize()::_lambda(bool,std::pair<unsigned_int_const,roaring::Roaring>&)_1_>
                    (iVar2._M_node,iVar3._M_node,1);
  return bVar1;
}

Assistant:

bool runOptimize() {
        return std::accumulate(
            roarings.begin(), roarings.end(), true,
            [](bool previous, std::pair<const uint32_t, Roaring> &map_entry) {
                return map_entry.second.runOptimize() && previous;
            });
    }